

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

void __thiscall
vk::BinaryRegistryDetail::anon_unknown_8::SparseIndexNode::~SparseIndexNode(SparseIndexNode *this)

{
  _Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  *this_00;
  SparseIndexNode *this_01;
  size_t in_RDX;
  size_t extraout_RDX;
  size_t ndx;
  ulong uVar1;
  
  for (uVar1 = 0;
      this_00 = (_Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                 *)(this->children).
                   super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
      uVar1 < (ulong)((long)(this->children).
                            super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3);
      uVar1 = uVar1 + 1) {
    this_01 = (SparseIndexNode *)(&(this_00->_M_impl).super__Vector_impl_data._M_start)[uVar1];
    if (this_01 != (SparseIndexNode *)0x0) {
      ~SparseIndexNode(this_01);
    }
    operator_delete(this_01,0x20);
    in_RDX = extraout_RDX;
  }
  std::
  _Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  ::_M_deallocate(this_00,(pointer)((long)(this->children).
                                          super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)this_00 >> 3),in_RDX);
  return;
}

Assistant:

~SparseIndexNode (void)
	{
		for (size_t ndx = 0; ndx < children.size(); ndx++)
			delete children[ndx];
	}